

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::scan
               (NameMapper *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  StringEq *pSVar5;
  ContBind *pCVar6;
  RefI31 *pRVar7;
  TableGet *pTVar8;
  CallRef *pCVar9;
  SIMDExtract *pSVar10;
  Call *pCVar11;
  ArrayInitData *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Switch *pSVar16;
  ArrayNew *pAVar17;
  Return *pRVar18;
  StructNew *pSVar19;
  BrOn *pBVar20;
  Suspend *pSVar21;
  Store *pSVar22;
  Throw *pTVar23;
  ArrayFill *pAVar24;
  ResumeThrow *pRVar25;
  TupleMake *pTVar26;
  StringNew *pSVar27;
  ArrayNewFixed *pAVar28;
  Expression **currp_00;
  Expression **currp_01;
  Expression **extraout_RDX;
  Expression **currp_02;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  StringEq *currp_03;
  Expression **currp_04;
  Expression **currp_05;
  PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_> *pPVar29;
  ulong uVar30;
  Break *pBVar31;
  StringConcat *currp_06;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBlock,
               currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar30 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case IfId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitIf,
               currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::If>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::maybePushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,(TaskFunc)((If *)pAVar24 + 0x20),currp_02);
    goto LAB_00119700;
  case LoopId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitLoop,
               currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00119281;
  case BreakId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBreak,
               currp);
    pBVar31 = Expression::cast<wasm::Break>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::maybePushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,(TaskFunc)(pBVar31 + 0x28),currp_01);
    pBVar31 = pBVar31 + 0x20;
    ppEVar4 = extraout_RDX;
    goto LAB_0011915f;
  case SwitchId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitSwitch
               ,currp);
    pSVar16 = Expression::cast<wasm::Switch>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pSVar16 + 0x48));
    pBVar31 = (Break *)(pSVar16 + 0x40);
    ppEVar4 = extraout_RDX_00;
    goto LAB_0011915f;
  case CallId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitCall,
               currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar30 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case CallIndirectId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitCallIndirect,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pCVar13 + 0x38));
    uVar30 = (ulong)*(uint *)(pCVar13 + 0x20);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar13 + 0x18),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitLocalSet,currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00119515;
  case GlobalGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitGlobalSet,currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00119281;
  case LoadId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitLoad,
               currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    currp_06 = (StringConcat *)(pLVar14 + 0x30);
    goto LAB_00119718;
  case StoreId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitStore,
               currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_001194d8;
  case ConstId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitConst,
               currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitUnary,
               currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_00119515;
  case BinaryId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBinary,
               currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::Binary>(this);
    goto LAB_00119472;
  case SelectId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitSelect,
               currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::Select>(this);
    goto LAB_001196f1;
  case DropId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitDrop,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::Drop>(this);
    goto LAB_00119322;
  case ReturnId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitReturn,
               currp);
    pRVar18 = Expression::cast<wasm::Return>(this);
    pBVar31 = (Break *)(pRVar18 + 0x10);
    ppEVar4 = extraout_RDX_02;
    goto LAB_0011915f;
  case MemorySizeId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryGrow,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00119322;
  case NopId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitNop,
               currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicRMW,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00119560;
  case AtomicCmpxchgId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicCmpxchg,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00119551;
  case AtomicWaitId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicWait,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_001192a5;
  case AtomicNotifyId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicNotify,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00119472;
  case AtomicFenceId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDExtract,currp);
    pSVar10 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00119515;
  case SIMDReplaceId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDReplace,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::SIMDReplace>(this);
    currp_03 = (StringEq *)((SIMDReplace *)pSVar5 + 0x28);
    goto LAB_00119480;
  case SIMDShuffleId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDShuffle,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00119700;
  case SIMDTernaryId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDTernary,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_001192a5;
  case SIMDShiftId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDShift,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00119472;
  case SIMDLoadId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDLoad,currp);
    pBVar20 = (BrOn *)Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00119400;
  case SIMDLoadStoreLaneId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_001194d8:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)(pSVar22 + 0x38));
    currp_06 = (StringConcat *)(pSVar22 + 0x30);
    goto LAB_00119718;
  case MemoryInitId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryInit,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00119551;
  case DataDropId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryCopy,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_001196f1;
  case MemoryFillId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryFill,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_001196f1;
  case PopId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitPop,
               currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefNull
               ,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitRefIsNull,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00119322;
  case RefFuncId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefFunc
               ,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefEq,
               currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00119700;
  case TableGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableGet,currp);
    pTVar8 = Expression::cast<wasm::TableGet>(this);
LAB_00119281:
    currp_06 = (StringConcat *)(pTVar8 + 0x20);
    goto LAB_00119718;
  case TableSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableSet,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00119560;
  case TableSizeId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableGrow,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00119560;
  case TableFillId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableFill,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00119551;
  case TableCopyId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableCopy,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_001196f1;
  case TableInitId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableInit,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00119551;
  case TryId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitTry,
               currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar30 = (ulong)*(uint *)(pTVar15 + 0x50);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar15 + 0x48),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    currp_06 = (StringConcat *)(pTVar15 + 0x20);
    goto LAB_00119718;
  case TryTableId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTryTable,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TryTable>(this);
    goto LAB_00119322;
  case ThrowId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitThrow,
               currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar30 = (ulong)*(uint *)(pTVar23 + 0x28);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar23 + 0x20),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case RethrowId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRethrow
               ,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitThrowRef,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00119322;
  case TupleMakeId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitTupleMake,currp);
    pTVar26 = Expression::cast<wasm::TupleMake>(this);
    uVar30 = (ulong)*(uint *)(pTVar26 + 0x18);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar26 + 0x10),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTupleExtract,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00119322;
  case RefI31Id:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefI31,
               currp);
    pRVar7 = Expression::cast<wasm::RefI31>(this);
    goto LAB_00119322;
  case I31GetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitI31Get,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00119322;
  case CallRefId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pCVar9 + 0x30));
    uVar30 = (ulong)*(uint *)(pCVar9 + 0x18);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar9 + 0x10),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case RefTestId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefTest
               ,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00119322;
  case RefCastId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefCast
               ,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00119322;
  case BrOnId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBrOn,
               currp);
    pBVar20 = Expression::cast<wasm::BrOn>(this);
LAB_00119400:
    currp_06 = (StringConcat *)(pBVar20 + 0x28);
    goto LAB_00119718;
  case StructNewId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitStructNew,currp);
    pSVar19 = Expression::cast<wasm::StructNew>(this);
    uVar30 = (ulong)*(uint *)(pSVar19 + 0x18);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar19 + 0x10),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case StructGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructGet,currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_00119515;
  case StructSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructSet,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00119472;
  case StructRMWId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructRMW,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00119472;
  case StructCmpxchgId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructCmpxchg,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_001192a5:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)(pSVar5 + 0x28));
    currp_03 = pSVar5 + 0x20;
    goto LAB_00119480;
  case ArrayNewId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitArrayNew,currp);
    pAVar17 = Expression::cast<wasm::ArrayNew>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pAVar17 + 0x18));
    pBVar31 = (Break *)(pAVar17 + 0x10);
    ppEVar4 = extraout_RDX_01;
LAB_0011915f:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::maybePushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               (TaskFunc)pBVar31,ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayNewData,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00119560;
  case ArrayNewElemId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayNewElem,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00119560;
  case ArrayNewFixedId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitArrayNewFixed,currp);
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar30 = (ulong)*(uint *)(pAVar28 + 0x18);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pAVar28 + 0x10),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayGet,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00119700;
  case ArraySetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArraySet,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_001196f1;
  case ArrayLenId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayLen,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00119322;
  case ArrayCopyId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitArrayCopy,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)((ArrayCopy *)pAVar24 + 0x30));
    goto LAB_001196e2;
  case ArrayFillId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayFill,currp);
    pAVar24 = Expression::cast<wasm::ArrayFill>(this);
LAB_001196e2:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)((StringConcat *)pAVar24 + 0x28));
    goto LAB_001196f1;
  case ArrayInitDataId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayInitData,currp);
    pAVar12 = Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_00118da1;
  case ArrayInitElemId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayInitElem,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_00118da1:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)(pAVar12 + 0x38));
LAB_00119551:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)(pAVar12 + 0x30));
LAB_00119560:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)(pAVar12 + 0x28));
    currp_06 = (StringConcat *)(pAVar12 + 0x20);
    goto LAB_00119718;
  case RefAsId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefAs,
               currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00119515;
  case StringNewId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitStringNew,currp);
    pSVar27 = Expression::cast<wasm::StringNew>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::maybePushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,(TaskFunc)(pSVar27 + 0x28),currp_04);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::maybePushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,(TaskFunc)(pSVar27 + 0x20),currp_05);
    currp_06 = (StringConcat *)(pSVar27 + 0x18);
    goto LAB_00119718;
  case StringConstId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringMeasure,currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
LAB_00119515:
    currp_06 = (StringConcat *)(pSVar10 + 0x18);
    goto LAB_00119718;
  case StringEncodeId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitStringEncode,currp);
    pSVar5 = (StringEq *)Expression::cast<wasm::StringEncode>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::maybePushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,(TaskFunc)((StringEncode *)pSVar5 + 0x28),currp_00);
    currp_03 = (StringEq *)((StringEncode *)pSVar5 + 0x20);
    goto LAB_00119480;
  case StringConcatId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringConcat,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00119700;
  case StringEqId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringEq,currp);
    pSVar5 = Expression::cast<wasm::StringEq>(this);
LAB_00119472:
    currp_03 = pSVar5 + 0x20;
LAB_00119480:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)currp_03);
    currp_06 = (StringConcat *)(pSVar5 + 0x18);
    goto LAB_00119718;
  case StringWTF16GetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringWTF16Get,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00119700;
  case StringSliceWTFId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringSliceWTF,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_001196f1:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)((StringConcat *)pAVar24 + 0x20));
LAB_00119700:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)((StringConcat *)pAVar24 + 0x18));
    currp_06 = (StringConcat *)pAVar24 + 0x10;
    goto LAB_00119718;
  case ContNewId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitContNew
               ,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ContNew>(this);
LAB_00119322:
    currp_06 = (StringConcat *)(pRVar7 + 0x10);
LAB_00119718:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)currp_06);
    return;
  case ContBindId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pCVar6 + 0x30));
    uVar30 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case SuspendId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitSuspend,currp);
    pSVar21 = Expression::cast<wasm::Suspend>(this);
    uVar30 = (ulong)*(uint *)(pSVar21 + 0x28);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar21 + 0x20),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case ResumeId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitResume
               ,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pRVar2 + 0x70));
    uVar30 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case ResumeThrowId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitResumeThrow,currp);
    pRVar25 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pRVar25 + 0x80));
    uVar30 = (ulong)*(uint *)(pRVar25 + 0x68);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar25 + 0x60),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
    break;
  case StackSwitchId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
                doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar29->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
               ,scan,(Expression **)(pSVar3 + 0x40));
    uVar30 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar30);
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar29->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }